

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

QMetaProperty * __thiscall QMetaObject::userProperty(QMetaObject *this)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RSI;
  QMetaProperty *in_RDI;
  QMetaProperty *prop;
  int i;
  int propCount;
  QMetaProperty *this_00;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  this_00 = in_RDI;
  iVar2 = propertyCount((QMetaObject *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)
                       );
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 < 0) {
      QMetaProperty::QMetaProperty((QMetaProperty *)0x3600a1);
      return in_RDI;
    }
    this_00->mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
    (this_00->data).d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
    (this_00->menum).mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
    (this_00->menum).data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
    property((QMetaObject *)prop,(int)((ulong)in_RSI >> 0x20));
    bVar1 = QMetaProperty::isUser(this_00);
  } while (!bVar1);
  return in_RDI;
}

Assistant:

QMetaProperty QMetaObject::userProperty() const
{
    const int propCount = propertyCount();
    for (int i = propCount - 1; i >= 0; --i) {
        const QMetaProperty prop = property(i);
        if (prop.isUser())
            return prop;
    }
    return QMetaProperty();
}